

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerFlight::Tick(APowerFlight *this)

{
  APowerFlight *this_local;
  
  if ((!multiplayer) && ((::level.flags2 & 0x10000) != 0)) {
    if (0x7ffffffe < *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc) {
      __assert_fail("EffectTics < INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_artifacts.cpp"
                    ,0x3eb,"virtual void APowerFlight::Tick()");
    }
    *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc =
         *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc + 1;
  }
  APowerup::Tick(&this->super_APowerup);
  return;
}

Assistant:

void APowerFlight::Tick ()
{
	// The Wings of Wrath only expire in multiplayer and non-hub games
	if (!multiplayer && (level.flags2 & LEVEL2_INFINITE_FLIGHT))
	{
		assert(EffectTics < INT_MAX); // I can't see a game lasting nearly two years, but...
		EffectTics++;
	}

	Super::Tick ();

//	Owner->flags |= MF_NOGRAVITY;
//	Owner->flags2 |= MF2_FLY;
}